

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

String fromCString(char *buf)

{
  size_t __size;
  String psVar1;
  char *__dest;
  
  __size = strlen(buf);
  psVar1 = (String)malloc(0x18);
  __dest = (char *)malloc(__size);
  psVar1->data = __dest;
  psVar1->capacity = __size;
  psVar1->length = __size;
  memcpy(__dest,buf,__size);
  return psVar1;
}

Assistant:

String fromCString(const char *buf) {
    size_t len = strlen(buf);
    String s = malloc(sizeof(struct string));
    s->data = malloc(sizeof(char) * len);
    s->capacity = len;
    s->length = len;
    memcpy(s->data, buf, sizeof(char) * len);
    return s;
}